

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O3

void __thiscall dg::llvmdg::legacy::Block::dumpEdges(Block *this,ostream *ostream)

{
  Function *pFVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  Block *pBVar4;
  Block *this_00;
  _Base_ptr p_Var5;
  Block *this_01;
  int __status;
  char *pcVar6;
  ulong uVar7;
  string local_88;
  string local_68;
  Block *local_48;
  ostream *local_40;
  _Rb_tree_node_base *local_38;
  
  pcVar6 = (char *)ostream;
  for (p_Var3 = (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->successors_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pBVar4 = *(Block **)(p_Var3 + 1);
    dotName_abi_cxx11_(&local_68,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostream,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
    dotName_abi_cxx11_(&local_88,pBVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
    pcVar6 = "\n";
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      pcVar6 = (char *)(local_88.field_2._M_allocated_capacity + 1);
      operator_delete(local_88._M_dataplus._M_p,(ulong)pcVar6);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      pcVar6 = (char *)(local_68.field_2._M_allocated_capacity + 1);
      operator_delete(local_68._M_dataplus._M_p,(ulong)pcVar6);
    }
  }
  p_Var5 = (this->callees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->callees_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_38) {
    local_48 = this;
    local_40 = ostream;
    do {
      pFVar1 = (Function *)p_Var5[1]._M_parent;
      dotName_abi_cxx11_(&local_68,this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (ostream,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
      pBVar4 = Function::entry(pFVar1);
      dotName_abi_cxx11_(&local_88,pBVar4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
      __status = 0x13d073;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," [style=dashed, constraint=false]\n",0x22);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar7 = local_88.field_2._M_allocated_capacity + 1;
        operator_delete(local_88._M_dataplus._M_p,uVar7);
        __status = (int)uVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        uVar7 = local_68.field_2._M_allocated_capacity + 1;
        operator_delete(local_68._M_dataplus._M_p,uVar7);
        __status = (int)uVar7;
      }
      Function::exit(pFVar1,__status);
      dotName_abi_cxx11_(&local_68,this_00);
      ostream = local_40;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
      this = local_48;
      dotName_abi_cxx11_(&local_88,local_48);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
      pcVar6 = " [style=dashed, constraint=false]\n";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," [style=dashed, constraint=false]\n",0x22);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        pcVar6 = (char *)(local_88.field_2._M_allocated_capacity + 1);
        operator_delete(local_88._M_dataplus._M_p,(ulong)pcVar6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        pcVar6 = (char *)(local_68.field_2._M_allocated_capacity + 1);
        operator_delete(local_68._M_dataplus._M_p,(ulong)pcVar6);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_38);
  }
  for (p_Var3 = (this->forks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->forks_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pFVar1 = (Function *)p_Var3[1]._M_parent;
    dotName_abi_cxx11_(&local_68,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostream,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
    pBVar4 = Function::entry(pFVar1);
    dotName_abi_cxx11_(&local_88,pBVar4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
    pcVar6 = " [style=dotted, constraint=false]\n";
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," [style=dotted, constraint=false]\n",0x22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      pcVar6 = (char *)(local_88.field_2._M_allocated_capacity + 1);
      operator_delete(local_88._M_dataplus._M_p,(ulong)pcVar6);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      pcVar6 = (char *)(local_68.field_2._M_allocated_capacity + 1);
      operator_delete(local_68._M_dataplus._M_p,(ulong)pcVar6);
    }
  }
  for (p_Var3 = (this->joins_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->joins_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    Function::exit((Function *)p_Var3[1]._M_parent,(int)pcVar6);
    dotName_abi_cxx11_(&local_68,this_01);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostream,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
    dotName_abi_cxx11_(&local_88,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
    pcVar6 = " [style=dotted, constraint=false]\n";
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," [style=dotted, constraint=false]\n",0x22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      pcVar6 = (char *)(local_88.field_2._M_allocated_capacity + 1);
      operator_delete(local_88._M_dataplus._M_p,(ulong)pcVar6);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      pcVar6 = (char *)(local_68.field_2._M_allocated_capacity + 1);
      operator_delete(local_68._M_dataplus._M_p,(ulong)pcVar6);
    }
  }
  return;
}

Assistant:

void Block::dumpEdges(std::ostream &ostream) const {
    for (auto *successor : successors_) {
        ostream << this->dotName() << " -> " << successor->dotName() << "\n";
    }

    for (auto callee : callees_) {
        ostream << this->dotName() << " -> "
                << callee.second->entry()->dotName()
                << " [style=dashed, constraint=false]\n";
        ostream << callee.second->exit()->dotName() << " -> " << this->dotName()
                << " [style=dashed, constraint=false]\n";
    }

    for (auto fork : forks_) {
        ostream << this->dotName() << " -> " << fork.second->entry()->dotName()
                << " [style=dotted, constraint=false]\n";
    }

    for (auto join : joins_) {
        ostream << join.second->exit()->dotName() << " -> " << this->dotName()
                << " [style=dotted, constraint=false]\n";
    }
}